

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createSubdivPlane
          (SceneGraph *this,Vec3fa *p0,Vec3fa *dx,Vec3fa *dy,size_t width,size_t height,
          float tessellationRate,Ref<embree::SceneGraph::MaterialNode> material)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  SubdivMeshNode *this_01;
  Vec3fa *pVVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  size_t sVar17;
  ulong uVar18;
  long lVar19;
  size_t sVar20;
  long lVar21;
  ulong uVar22;
  size_t sVar23;
  float fVar24;
  float fVar25;
  Ref<embree::SceneGraph::MaterialNode> local_58;
  ulong local_50;
  Vec3fa *local_48;
  Node *local_40;
  Vec3fa *local_38;
  
  local_48 = dy;
  local_40 = (Node *)this;
  this_01 = (SubdivMeshNode *)::operator_new(0x1b0);
  local_58.ptr = (MaterialNode *)((material.ptr)->super_Node).super_RefCount._vptr_RefCount;
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  SubdivMeshNode::SubdivMeshNode(this_01,&local_58,(BBox1f)0x3f80000000000000,1);
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  this_01->tessellationRate = tessellationRate;
  pvVar3 = (this_01->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_50 = height + 1;
  uVar13 = local_50 * (width + 1);
  uVar15 = pvVar3->size_alloced;
  uVar18 = uVar15;
  if ((uVar15 < uVar13) && (uVar22 = uVar15, uVar18 = uVar13, uVar15 != 0)) {
    for (; uVar18 = uVar22, uVar22 < uVar13; uVar22 = uVar22 * 2 + (ulong)(uVar22 * 2 == 0)) {
    }
  }
  if (uVar13 < pvVar3->size_active) {
    pvVar3->size_active = uVar13;
  }
  if (uVar15 == uVar18) {
    pvVar3->size_active = uVar13;
  }
  else {
    local_38 = pvVar3->items;
    pVVar12 = (Vec3fa *)alignedMalloc(uVar18 << 4,0x10);
    pvVar3->items = pVVar12;
    lVar14 = 0;
    for (uVar15 = 0; uVar15 < pvVar3->size_active; uVar15 = uVar15 + 1) {
      puVar1 = (undefined8 *)((long)&local_38->field_0 + lVar14);
      uVar11 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pvVar3->items->field_0 + lVar14);
      *puVar2 = *puVar1;
      puVar2[1] = uVar11;
      lVar14 = lVar14 + 0x10;
    }
    alignedFree(local_38);
    pvVar3->size_active = uVar13;
    pvVar3->size_alloced = uVar18;
  }
  this_00 = &this_01->position_indices;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this_00,width * height * 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this_01->verticesPerFace,width * height);
  lVar14 = 0;
  for (uVar15 = 0; uVar15 != local_50; uVar15 = uVar15 + 1) {
    fVar24 = (float)uVar15 / (float)height;
    lVar16 = lVar14;
    for (uVar18 = 0; width + 1 != uVar18; uVar18 = uVar18 + 1) {
      fVar25 = (float)uVar18 / (float)width;
      fVar5 = (dx->field_0).m128[1];
      fVar6 = (dx->field_0).m128[2];
      fVar7 = (p0->field_0).m128[1];
      fVar8 = (p0->field_0).m128[2];
      fVar9 = (local_48->field_0).m128[1];
      fVar10 = (local_48->field_0).m128[2];
      *(float *)((long)&((this_01->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar16) =
           (local_48->field_0).m128[0] * fVar24 +
           fVar25 * (dx->field_0).m128[0] + (p0->field_0).m128[0];
      *(float *)((long)&((this_01->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar16 + 4) =
           fVar9 * fVar24 + fVar25 * fVar5 + fVar7;
      *(float *)((long)&((this_01->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar16 + 8) =
           fVar10 * fVar24 + fVar25 * fVar6 + fVar8;
      lVar16 = lVar16 + 0x10;
    }
    lVar14 = lVar14 + width * 0x10 + 0x10;
  }
  uVar15 = (ulong)((int)width + 1);
  lVar14 = 0;
  lVar16 = 0;
  lVar19 = 0;
  sVar20 = 0;
  sVar17 = width;
  while (sVar20 != height) {
    sVar20 = sVar20 + 1;
    lVar21 = lVar16;
    for (sVar23 = 0; width != sVar23; sVar23 = sVar23 + 1) {
      iVar4 = (int)sVar23;
      *(int *)((long)(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start + lVar21) = (int)lVar14 + iVar4;
      *(int *)((long)(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start + lVar21 + 4) =
           (int)lVar14 + iVar4 + 1;
      *(int *)((long)(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start + lVar21 + 8) =
           (int)sVar17 + 2 + iVar4;
      *(int *)((long)(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start + lVar21 + 0xc) =
           (int)sVar17 + 1 + iVar4;
      *(undefined4 *)
       ((long)(this_01->verticesPerFace).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start + sVar23 * 4 + lVar19) = 4;
      lVar21 = lVar21 + 0x10;
    }
    lVar19 = lVar19 + width * 4;
    lVar16 = lVar16 + width * 0x10;
    lVar14 = lVar14 + uVar15;
    sVar17 = sVar17 + uVar15;
  }
  this_01->position_subdiv_mode = RTC_SUBDIVISION_MODE_PIN_CORNERS;
  (local_40->super_RefCount)._vptr_RefCount = (_func_int **)this_01;
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[3])(this_01);
  return (Ref<embree::SceneGraph::Node>)local_40;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createSubdivPlane (const Vec3fa& p0, const Vec3fa& dx, const Vec3fa& dy, size_t width, size_t height, float tessellationRate, Ref<MaterialNode> material)
  {
    Ref<SceneGraph::SubdivMeshNode> mesh = new SceneGraph::SubdivMeshNode(material,BBox1f(0,1),1);
    mesh->tessellationRate = tessellationRate;
    mesh->positions[0].resize((width+1)*(height+1));
    mesh->position_indices.resize(4*width*height);
    mesh->verticesPerFace.resize(width*height);

    for (size_t y=0; y<=height; y++) {
      for (size_t x=0; x<=width; x++) {
        Vec3fa p = p0+float(x)/float(width)*dx+float(y)/float(height)*dy;
        size_t i = y*(width+1)+x;
        mesh->positions[0][i].x = p.x;
        mesh->positions[0][i].y = p.y;
        mesh->positions[0][i].z = p.z;
      }
    }
    for (size_t y=0; y<height; y++) {
      for (size_t x=0; x<width; x++) {
        size_t i = y*width+x;
        size_t p00 = (y+0)*(width+1)+(x+0);
        size_t p01 = (y+0)*(width+1)+(x+1);
        size_t p10 = (y+1)*(width+1)+(x+0);
        size_t p11 = (y+1)*(width+1)+(x+1);
        mesh->position_indices[4*i+0] = unsigned(p00); 
        mesh->position_indices[4*i+1] = unsigned(p01); 
        mesh->position_indices[4*i+2] = unsigned(p11); 
        mesh->position_indices[4*i+3] = unsigned(p10);
        mesh->verticesPerFace[i] = 4;
      }
    }
    mesh->position_subdiv_mode = RTC_SUBDIVISION_MODE_PIN_CORNERS;
    return mesh.dynamicCast<SceneGraph::Node>();
  }